

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

void andres::marray_detail::
     operate<andres::marray_detail::DividedByEqual<float,float>,float,float,true,std::allocator<unsigned_long>>
               (View<float,_false,_std::allocator<unsigned_long>_> *v,
               View<float,_true,_std::allocator<unsigned_long>_> *w)

{
  CoordinateOrder CVar1;
  reference pfVar2;
  bool bVar3;
  size_t sVar4;
  size_t sVar5;
  runtime_error *this;
  reference pfVar6;
  reference pfVar7;
  reference pfVar8;
  float *pfVar9;
  float *pfVar10;
  reference pfVar11;
  reference pfVar12;
  void *dataPointer_;
  void *vDataPointer_;
  ulong uVar13;
  Marray<float,_std::allocator<unsigned_long>_> m;
  const_iterator itW;
  Iterator<float,_false,_std::allocator<unsigned_long>_> local_a8;
  long local_78;
  float local_60 [6];
  pointer local_48;
  pointer local_38;
  
  if (((v->geometry_).size_ == 0) || ((w->geometry_).size_ == 0)) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Assertion failed.");
    goto LAB_00212495;
  }
  if (w->data_ == (pointer)0x0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Assertion failed.");
    goto LAB_00212495;
  }
  sVar4 = (w->geometry_).dimension_;
  if (sVar4 != 0) {
    if (v->data_ == (pointer)0x0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Assertion failed.");
    }
    else {
      if ((v->geometry_).dimension_ == sVar4) {
        uVar13 = 0;
LAB_00211b89:
        if (uVar13 < (v->geometry_).dimension_) {
          sVar4 = View<float,_false,_std::allocator<unsigned_long>_>::shape(v,uVar13);
          sVar5 = View<float,_true,_std::allocator<unsigned_long>_>::shape(w,uVar13);
          if (sVar4 == sVar5) goto code_r0x00211bb1;
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this,"Assertion failed.");
          goto LAB_00212495;
        }
        if (w->data_ == (pointer)0x0) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this,"Assertion failed.");
          goto LAB_00212495;
        }
        if ((w->geometry_).dimension_ == 0) goto LAB_00211c9c;
        View<float,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
        View<float,_true,_std::allocator<unsigned_long>_>::testInvariant(w);
        pfVar8 = v->data_;
        if ((pfVar8 != (reference)0x0) && (pfVar2 = w->data_, pfVar2 != (reference)0x0)) {
          pfVar6 = View<float,_false,_std::allocator<unsigned_long>_>::operator()
                             (v,(v->geometry_).size_ - 1);
          pfVar7 = View<float,_true,_std::allocator<unsigned_long>_>::operator()
                             (w,(w->geometry_).size_ - 1);
          if (((pfVar8 <= pfVar2) && (pfVar2 <= pfVar6)) ||
             ((pfVar2 <= pfVar8 && (pfVar8 <= pfVar7)))) {
            Marray<float,std::allocator<unsigned_long>>::
            Marray<float,true,std::allocator<unsigned_long>>
                      ((Marray<float,std::allocator<unsigned_long>> *)&local_a8,w);
            operate<andres::marray_detail::DividedByEqual<float,float>,float,float,false,std::allocator<unsigned_long>>
                      (v,&local_a8);
            operator_delete((void *)CONCAT44(local_a8.view_._4_4_,local_a8.view_._0_4_),
                            local_78 << 2);
            uVar13 = (long)local_a8.coordinates_.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage * 0x18;
            goto LAB_00211c92;
          }
        }
        View<float,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
        CVar1 = (v->geometry_).coordinateOrder_;
        View<float,_true,_std::allocator<unsigned_long>_>::testInvariant(w);
        if (((CVar1 == (w->geometry_).coordinateOrder_) &&
            (View<float,_false,_std::allocator<unsigned_long>_>::testInvariant(v),
            (v->geometry_).isSimple_ == true)) &&
           (View<float,_true,_std::allocator<unsigned_long>_>::testInvariant(w),
           (w->geometry_).isSimple_ == true)) {
          local_a8.view_._0_4_ = 0;
          pfVar8 = AccessOperatorHelper<true>::
                   execute<float,int,false,std::allocator<unsigned_long>>(v,(int *)&local_a8);
          local_a8.view_._0_4_ = 0;
          pfVar7 = AccessOperatorHelper<true>::execute<float,int,true,std::allocator<unsigned_long>>
                             (w,(int *)&local_a8);
          sVar4 = (v->geometry_).size_;
          if (sVar4 == 0) {
            return;
          }
          sVar5 = 0;
          do {
            pfVar8[sVar5] = pfVar8[sVar5] / pfVar7[sVar5];
            sVar5 = sVar5 + 1;
          } while (sVar4 != sVar5);
          return;
        }
        if (v->data_ != (pointer)0x0) {
          switch((v->geometry_).dimension_) {
          case 1:
            local_a8.view_._0_4_ = 0;
            pfVar9 = AccessOperatorHelper<true>::
                     execute<float,int,false,std::allocator<unsigned_long>>(v,(int *)&local_a8);
            local_a8.view_._0_4_ = 0;
            pfVar10 = AccessOperatorHelper<true>::
                      execute<float,int,true,std::allocator<unsigned_long>>(w,(int *)&local_a8);
            sVar4 = View<float,_false,_std::allocator<unsigned_long>_>::shape(v,0);
            if (sVar4 != 0) {
              uVar13 = 0;
              do {
                *pfVar9 = *pfVar9 / *pfVar10;
                sVar4 = View<float,_false,_std::allocator<unsigned_long>_>::strides(v,0);
                pfVar9 = pfVar9 + sVar4;
                sVar4 = View<float,_true,_std::allocator<unsigned_long>_>::strides(w,0);
                pfVar10 = pfVar10 + sVar4;
                uVar13 = uVar13 + 1;
                sVar4 = View<float,_false,_std::allocator<unsigned_long>_>::shape(v,0);
              } while (uVar13 < sVar4);
            }
            View<float,_false,_std::allocator<unsigned_long>_>::shape(v,0);
            View<float,_false,_std::allocator<unsigned_long>_>::strides(v,0);
            View<float,_true,_std::allocator<unsigned_long>_>::shape(w,0);
            View<float,_true,_std::allocator<unsigned_long>_>::strides(w,0);
            return;
          case 2:
            local_a8.view_._0_4_ = 0;
            pfVar8 = AccessOperatorHelper<true>::
                     execute<float,int,false,std::allocator<unsigned_long>>(v,(int *)&local_a8);
            local_a8.view_._0_4_ = 0;
            pfVar7 = AccessOperatorHelper<true>::
                     execute<float,int,true,std::allocator<unsigned_long>>(w,(int *)&local_a8);
            OperateHelperBinary<(unsigned_short)2,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
            ::operate(v,w,pfVar8,pfVar7);
            return;
          case 3:
            local_a8.view_._0_4_ = 0;
            pfVar8 = AccessOperatorHelper<true>::
                     execute<float,int,false,std::allocator<unsigned_long>>(v,(int *)&local_a8);
            local_a8.view_._0_4_ = 0;
            pfVar7 = AccessOperatorHelper<true>::
                     execute<float,int,true,std::allocator<unsigned_long>>(w,(int *)&local_a8);
            OperateHelperBinary<(unsigned_short)3,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
            ::operate(v,w,pfVar8,pfVar7);
            return;
          case 4:
            local_a8.view_._0_4_ = 0;
            pfVar8 = AccessOperatorHelper<true>::
                     execute<float,int,false,std::allocator<unsigned_long>>(v,(int *)&local_a8);
            local_a8.view_._0_4_ = 0;
            pfVar7 = AccessOperatorHelper<true>::
                     execute<float,int,true,std::allocator<unsigned_long>>(w,(int *)&local_a8);
            OperateHelperBinary<(unsigned_short)4,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
            ::operate(v,w,pfVar8,pfVar7);
            return;
          }
          sVar4 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
          if (sVar4 == 5) {
            local_a8.view_._0_4_ = 0;
            pfVar8 = AccessOperatorHelper<true>::
                     execute<float,int,false,std::allocator<unsigned_long>>(v,(int *)&local_a8);
            local_a8.view_._0_4_ = 0;
            pfVar7 = AccessOperatorHelper<true>::
                     execute<float,int,true,std::allocator<unsigned_long>>(w,(int *)&local_a8);
            OperateHelperBinary<(unsigned_short)5,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
            ::operate(v,w,pfVar8,pfVar7);
            return;
          }
          sVar4 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
          if (sVar4 == 6) {
            local_a8.view_._0_4_ = 0;
            pfVar8 = AccessOperatorHelper<true>::
                     execute<float,int,false,std::allocator<unsigned_long>>(v,(int *)&local_a8);
            local_a8.view_._0_4_ = 0;
            pfVar7 = AccessOperatorHelper<true>::
                     execute<float,int,true,std::allocator<unsigned_long>>(w,(int *)&local_a8);
            OperateHelperBinary<(unsigned_short)6,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
            ::operate(v,w,pfVar8,pfVar7);
            return;
          }
          sVar4 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
          if (sVar4 == 7) {
            local_a8.view_._0_4_ = 0;
            pfVar8 = AccessOperatorHelper<true>::
                     execute<float,int,false,std::allocator<unsigned_long>>(v,(int *)&local_a8);
            local_a8.view_._0_4_ = 0;
            pfVar7 = AccessOperatorHelper<true>::
                     execute<float,int,true,std::allocator<unsigned_long>>(w,(int *)&local_a8);
            OperateHelperBinary<(unsigned_short)7,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
            ::operate(v,w,pfVar8,pfVar7);
            return;
          }
          sVar4 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
          if (sVar4 == 8) {
            local_a8.view_._0_4_ = 0;
            pfVar8 = AccessOperatorHelper<true>::
                     execute<float,int,false,std::allocator<unsigned_long>>(v,(int *)&local_a8);
            local_a8.view_._0_4_ = 0;
            pfVar7 = AccessOperatorHelper<true>::
                     execute<float,int,true,std::allocator<unsigned_long>>(w,(int *)&local_a8);
            OperateHelperBinary<(unsigned_short)8,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
            ::operate(v,w,pfVar8,pfVar7);
            return;
          }
          sVar4 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
          if (sVar4 == 9) {
            local_a8.view_._0_4_ = 0;
            pfVar8 = AccessOperatorHelper<true>::
                     execute<float,int,false,std::allocator<unsigned_long>>(v,(int *)&local_a8);
            local_a8.view_._0_4_ = 0;
            pfVar7 = AccessOperatorHelper<true>::
                     execute<float,int,true,std::allocator<unsigned_long>>(w,(int *)&local_a8);
            OperateHelperBinary<(unsigned_short)9,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
            ::operate(v,w,pfVar8,pfVar7);
            return;
          }
          sVar4 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
          if (sVar4 == 10) {
            local_a8.view_._0_4_ = 0;
            pfVar8 = AccessOperatorHelper<true>::
                     execute<float,int,false,std::allocator<unsigned_long>>(v,(int *)&local_a8);
            local_a8.view_._0_4_ = 0;
            pfVar7 = AccessOperatorHelper<true>::
                     execute<float,int,true,std::allocator<unsigned_long>>(w,(int *)&local_a8);
            OperateHelperBinary<(unsigned_short)10,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
            ::operate(v,w,pfVar8,pfVar7);
            return;
          }
          View<float,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
          Iterator<float,_false,_std::allocator<unsigned_long>_>::Iterator(&local_a8,v,0);
          View<float,_true,_std::allocator<unsigned_long>_>::testInvariant(w);
          Iterator<float,_true,_std::allocator<unsigned_long>_>::Iterator
                    ((Iterator<float,_true,_std::allocator<unsigned_long>_> *)local_60,w,0);
          while (bVar3 = Iterator<float,_false,_std::allocator<unsigned_long>_>::hasMore(&local_a8),
                bVar3) {
            bVar3 = Iterator<float,_true,_std::allocator<unsigned_long>_>::hasMore
                              ((Iterator<float,_true,_std::allocator<unsigned_long>_> *)local_60);
            Assert<bool>(bVar3);
            pfVar11 = Iterator<float,_false,_std::allocator<unsigned_long>_>::operator*(&local_a8);
            pfVar12 = Iterator<float,_true,_std::allocator<unsigned_long>_>::operator*
                                ((Iterator<float,_true,_std::allocator<unsigned_long>_> *)local_60);
            *pfVar11 = *pfVar11 / *pfVar12;
            Iterator<float,_false,_std::allocator<unsigned_long>_>::operator++(&local_a8);
            Iterator<float,_true,_std::allocator<unsigned_long>_>::operator++
                      ((Iterator<float,_true,_std::allocator<unsigned_long>_> *)local_60);
          }
          bVar3 = Iterator<float,_true,_std::allocator<unsigned_long>_>::hasMore
                            ((Iterator<float,_true,_std::allocator<unsigned_long>_> *)local_60);
          Assert<bool>(!bVar3);
          if (local_48 != (pointer)0x0) {
            operator_delete(local_48,(long)local_38 - (long)local_48);
          }
          goto LAB_00212453;
        }
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"Assertion failed.");
        goto LAB_00212495;
      }
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Assertion failed.");
    }
    goto LAB_00212495;
  }
LAB_00211c9c:
  local_a8.view_._0_4_ = 0;
  pfVar7 = AccessOperatorHelper<true>::execute<float,int,true,std::allocator<unsigned_long>>
                     (w,(int *)&local_a8);
  local_60[0] = *pfVar7;
  View<float,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
  if ((v->geometry_).isSimple_ == true) {
    local_a8.view_._0_4_ = 0;
    pfVar8 = AccessOperatorHelper<true>::execute<float,int,false,std::allocator<unsigned_long>>
                       (v,(int *)&local_a8);
    sVar4 = (v->geometry_).size_;
    if (sVar4 == 0) {
      return;
    }
    sVar5 = 0;
    do {
      pfVar8[sVar5] = pfVar8[sVar5] / local_60[0];
      sVar5 = sVar5 + 1;
    } while (sVar4 != sVar5);
    return;
  }
  if (v->data_ == (pointer)0x0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Assertion failed.");
    goto LAB_00212495;
  }
  switch((v->geometry_).dimension_) {
  case 1:
    local_a8.view_._0_4_ = 0;
    pfVar9 = AccessOperatorHelper<true>::execute<float,int,false,std::allocator<unsigned_long>>
                       (v,(int *)&local_a8);
    sVar4 = View<float,_false,_std::allocator<unsigned_long>_>::shape(v,0);
    if (sVar4 != 0) {
      uVar13 = 0;
      do {
        *pfVar9 = *pfVar9 / local_60[0];
        sVar4 = View<float,_false,_std::allocator<unsigned_long>_>::strides(v,0);
        pfVar9 = pfVar9 + sVar4;
        uVar13 = uVar13 + 1;
        sVar4 = View<float,_false,_std::allocator<unsigned_long>_>::shape(v,0);
      } while (uVar13 < sVar4);
    }
    View<float,_false,_std::allocator<unsigned_long>_>::shape(v,0);
    sVar4 = 0;
    goto LAB_00211f69;
  case 2:
    local_a8.view_._0_4_ = 0;
    pfVar8 = AccessOperatorHelper<true>::execute<float,int,false,std::allocator<unsigned_long>>
                       (v,(int *)&local_a8);
    OperateHelperBinaryScalar<(unsigned_short)2,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
    ::operate(v,local_60,pfVar8);
    break;
  case 3:
    local_a8.view_._0_4_ = 0;
    pfVar8 = AccessOperatorHelper<true>::execute<float,int,false,std::allocator<unsigned_long>>
                       (v,(int *)&local_a8);
    sVar4 = View<float,_false,_std::allocator<unsigned_long>_>::shape(v,2);
    if (sVar4 != 0) {
      uVar13 = 0;
      do {
        OperateHelperBinaryScalar<(unsigned_short)2,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
        ::operate(v,local_60,pfVar8);
        sVar4 = View<float,_false,_std::allocator<unsigned_long>_>::strides(v,2);
        pfVar8 = pfVar8 + sVar4;
        uVar13 = uVar13 + 1;
        sVar4 = View<float,_false,_std::allocator<unsigned_long>_>::shape(v,2);
      } while (uVar13 < sVar4);
    }
    View<float,_false,_std::allocator<unsigned_long>_>::shape(v,2);
    sVar4 = 2;
LAB_00211f69:
    View<float,_false,_std::allocator<unsigned_long>_>::strides(v,sVar4);
    break;
  case 4:
    local_a8.view_._0_4_ = 0;
    pfVar8 = AccessOperatorHelper<true>::execute<float,int,false,std::allocator<unsigned_long>>
                       (v,(int *)&local_a8);
    OperateHelperBinaryScalar<(unsigned_short)4,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
    ::operate(v,local_60,pfVar8);
    break;
  default:
    sVar4 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar4 == 5) {
      local_a8.view_._0_4_ = 0;
      pfVar8 = AccessOperatorHelper<true>::execute<float,int,false,std::allocator<unsigned_long>>
                         (v,(int *)&local_a8);
      OperateHelperBinaryScalar<(unsigned_short)5,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
      ::operate(v,local_60,pfVar8);
    }
    else {
      sVar4 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
      if (sVar4 == 6) {
        local_a8.view_._0_4_ = 0;
        pfVar8 = AccessOperatorHelper<true>::execute<float,int,false,std::allocator<unsigned_long>>
                           (v,(int *)&local_a8);
        OperateHelperBinaryScalar<(unsigned_short)6,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
        ::operate(v,local_60,pfVar8);
      }
      else {
        sVar4 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
        if (sVar4 == 7) {
          local_a8.view_._0_4_ = 0;
          pfVar8 = AccessOperatorHelper<true>::
                   execute<float,int,false,std::allocator<unsigned_long>>(v,(int *)&local_a8);
          OperateHelperBinaryScalar<(unsigned_short)7,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
          ::operate(v,local_60,pfVar8);
        }
        else {
          sVar4 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
          if (sVar4 == 8) {
            local_a8.view_._0_4_ = 0;
            pfVar8 = AccessOperatorHelper<true>::
                     execute<float,int,false,std::allocator<unsigned_long>>(v,(int *)&local_a8);
            OperateHelperBinaryScalar<(unsigned_short)8,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
            ::operate(v,local_60,pfVar8);
          }
          else {
            sVar4 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
            if (sVar4 == 9) {
              local_a8.view_._0_4_ = 0;
              pfVar8 = AccessOperatorHelper<true>::
                       execute<float,int,false,std::allocator<unsigned_long>>(v,(int *)&local_a8);
              OperateHelperBinaryScalar<(unsigned_short)9,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
              ::operate(v,local_60,pfVar8);
            }
            else {
              sVar4 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
              if (sVar4 == 10) {
                local_a8.view_._0_4_ = 0;
                pfVar8 = AccessOperatorHelper<true>::
                         execute<float,int,false,std::allocator<unsigned_long>>(v,(int *)&local_a8);
                OperateHelperBinaryScalar<(unsigned_short)10,_andres::marray_detail::DividedByEqual<float,_float>,_float,_float,_std::allocator<unsigned_long>_>
                ::operate(v,local_60,pfVar8);
              }
              else {
                View<float,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
                Iterator<float,_false,_std::allocator<unsigned_long>_>::Iterator(&local_a8,v,0);
                while (bVar3 = Iterator<float,_false,_std::allocator<unsigned_long>_>::hasMore
                                         (&local_a8), bVar3) {
                  pfVar11 = Iterator<float,_false,_std::allocator<unsigned_long>_>::operator*
                                      (&local_a8);
                  *pfVar11 = *pfVar11 / local_60[0];
                  Iterator<float,_false,_std::allocator<unsigned_long>_>::operator++(&local_a8);
                }
LAB_00212453:
                if (local_a8.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  uVar13 = (long)local_a8.coordinates_.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage -
                           (long)local_a8.coordinates_.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start;
                  local_a8.index_ =
                       (size_t)local_a8.coordinates_.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start;
LAB_00211c92:
                  operator_delete((void *)local_a8.index_,uVar13);
                }
              }
            }
          }
        }
      }
    }
  }
  return;
code_r0x00211bb1:
  uVar13 = uVar13 + 1;
  if (v->data_ == (pointer)0x0) goto code_r0x00211bba;
  goto LAB_00211b89;
code_r0x00211bba:
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Assertion failed.");
LAB_00212495:
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void 
operate
(
    View<T1, false, A>& v, 
    const View<T2, isConst, A>& w, 
    Functor f
)
{
    if(!MARRAY_NO_ARG_TEST) {
        Assert(v.size() != 0 && w.size() != 0);
        Assert(w.dimension() == 0 || v.dimension() == w.dimension());
        if(w.dimension() != 0) {
            for(std::size_t j=0; j<v.dimension(); ++j) {
                Assert(v.shape(j) == w.shape(j));
            }
        }
    }
    if(w.dimension() == 0) {
        T2 x = w(0);
        if(v.isSimple()) {
            T1* dataV = &v(0);
            for(std::size_t j=0; j<v.size(); ++j) {
                f(dataV[j], x);
            }
        }
        else if(v.dimension() == 1)
            OperateHelperBinaryScalar<1, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 2)
            OperateHelperBinaryScalar<2, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 3)
            OperateHelperBinaryScalar<3, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 4)
            OperateHelperBinaryScalar<4, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 5)
            OperateHelperBinaryScalar<5, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 6)
            OperateHelperBinaryScalar<6, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 7)
            OperateHelperBinaryScalar<7, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 8)
            OperateHelperBinaryScalar<8, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 9)
            OperateHelperBinaryScalar<9, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 10)
            OperateHelperBinaryScalar<10, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else {
            for(typename View<T1, false>::iterator it = v.begin(); it.hasMore(); ++it) {
                f(*it, x);
            }
        }
    }
    else {
        if(v.overlaps(w)) {
            Marray<T2> m = w; // temporary copy
            operate(v, m, f); // recursive call
        }
        else {
            if(v.coordinateOrder() == w.coordinateOrder() 
                && v.isSimple() && w.isSimple()) {
                T1* dataV = &v(0);
                const T2* dataW = &w(0);
                for(std::size_t j=0; j<v.size(); ++j) {
                    f(dataV[j], dataW[j]);
                }
            }
            else if(v.dimension() == 1)
                OperateHelperBinary<1, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 2)
                OperateHelperBinary<2, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 3)
                OperateHelperBinary<3, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 4)
                OperateHelperBinary<4, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 5)
                OperateHelperBinary<5, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 6)
                OperateHelperBinary<6, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 7)
                OperateHelperBinary<7, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 8)
                OperateHelperBinary<8, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 9)
                OperateHelperBinary<9, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 10)
                OperateHelperBinary<10, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else {
                typename View<T1, false>::iterator itV = v.begin();
                typename View<T2, isConst>::const_iterator itW = w.begin();
                for(; itV.hasMore(); ++itV, ++itW) {
                    Assert(MARRAY_NO_DEBUG || itW.hasMore());
                    f(*itV, *itW);
                }
                Assert(MARRAY_NO_DEBUG || !itW.hasMore());
            }
        }
    }
}